

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  int *piVar3;
  Layer *pLVar4;
  void *pvVar5;
  undefined4 *puVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined3 uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  size_t _elemsize;
  void *pvVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  Option *pOVar36;
  long lVar37;
  undefined1 (*pauVar38) [64];
  ulong uVar39;
  undefined1 (*pauVar40) [64];
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  v4sf one;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_ZMM30 [64];
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_240;
  ulong local_218;
  int local_208;
  Mat local_1f8;
  Mat local_1a8;
  Mat local_158;
  void *local_108;
  int *local_100;
  Allocator *local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  _func_int ***local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar56 [16];
  
  auVar54 = in_ZMM30._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar18 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar18;
  }
  uVar23 = bottom_blob->c;
  uVar22 = (ulong)uVar23;
  uVar26 = bottom_blob->elemsize;
  iVar18 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar30 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar29 = (this->super_ConvolutionDepthWise).dilation_h;
  iVar33 = bottom_blob->elempack;
  local_1f8.cstep = 0;
  local_1f8.data = (Allocator *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1f8.elempack = 0;
  local_1f8.h = 0;
  local_1f8.allocator = (Allocator *)local_1f8.data;
  local_1f8.dims = (int)local_1f8.refcount;
  local_1f8.w = local_1f8.refcount._4_4_;
  local_1f8.d = (int)local_1f8.refcount;
  local_1f8.c = local_1f8.elempack;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_1f8,opt);
  iVar17 = local_1f8.w;
  iVar19 = -100;
  if (((Allocator *)local_1f8.data == (Allocator *)0x0) ||
     ((long)local_1f8.c * local_1f8.cstep == 0)) goto LAB_003fea86;
  iVar18 = (~((iVar18 + -1) * iVar30) + local_1f8.w) / (this->super_ConvolutionDepthWise).stride_w;
  uVar32 = iVar18 + 1;
  iVar30 = (~((iVar21 + -1) * iVar29) + local_1f8.h) / (this->super_ConvolutionDepthWise).stride_h;
  uVar2 = (this->super_ConvolutionDepthWise).num_output;
  uVar39 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar2 & 0xf) == 0) {
      uVar39 = 0x10;
    }
    else if ((uVar2 & 7) == 0) {
      uVar39 = 8;
    }
    else {
      uVar39 = (ulong)((uint)((uVar2 & 3) == 0) * 3 + 1);
    }
  }
  uVar24 = (uint)uVar39;
  _elemsize = (uVar26 / (ulong)(long)iVar33) * uVar39;
  Mat::create(top_blob,uVar32,iVar30 + 1,(int)uVar2 / (int)uVar24,_elemsize,uVar24,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003fea86;
  iVar21 = (this->super_ConvolutionDepthWise).num_output;
  iVar29 = (this->super_ConvolutionDepthWise).group;
  if (iVar29 != iVar21 || iVar33 * uVar23 != iVar29) {
LAB_003fe1f0:
    uVar26 = (long)(int)(iVar33 * uVar23) / (long)iVar29;
    uVar22 = (long)iVar21 / (long)iVar29;
    iVar18 = 1;
    uVar23 = 1;
    if (opt->use_packing_layout == true) {
      uVar23 = 0x10;
      iVar18 = 0x10;
      if ((uVar26 & 0xf) != 0) {
        if ((uVar26 & 7) == 0) {
          iVar18 = 8;
        }
        else {
          iVar18 = (uint)((uVar26 & 3) == 0) * 3 + 1;
        }
      }
      if ((uVar22 & 0xf) != 0) {
        if ((uVar22 & 7) == 0) {
          uVar23 = 8;
        }
        else {
          uVar23 = (uint)((uVar22 & 3) == 0) * 3 + 1;
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
    local_1a8.refcount = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
    local_1a8.data = local_1f8.data;
    local_1a8.elemsize = local_1f8.elemsize;
    local_1a8.elempack = local_1f8.elempack;
    local_1a8.allocator = local_1f8.allocator;
    local_1a8.w = local_1f8.w;
    local_1a8.dims = local_1f8.dims;
    local_1a8.d = local_1f8.d;
    local_1a8.h = local_1f8.h;
    local_1a8.c = local_1f8.c;
    local_1a8.cstep = local_1f8.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (iVar18 < iVar33) {
      local_158.data = *(void **)opt;
      local_158.elemsize = (size_t)opt->workspace_allocator;
      local_158.elempack = opt->openmp_blocktime;
      local_158._28_1_ = opt->use_winograd_convolution;
      local_158._29_1_ = opt->use_sgemm_convolution;
      local_158._30_1_ = opt->use_int8_inference;
      local_158._31_1_ = opt->use_vulkan_compute;
      local_158.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_158._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
      local_158._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_158._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
      local_158.refcount = (int *)opt->workspace_allocator;
      convert_packing(&local_1f8,&local_1a8,iVar18,(Option *)&local_158);
      if (((Allocator *)local_1a8.data != (Allocator *)0x0) &&
         ((long)local_1a8.c * local_1a8.cstep != 0)) goto LAB_003fe358;
      iVar19 = -100;
    }
    else {
LAB_003fe358:
      piVar3 = top_blob->refcount;
      local_158.data = top_blob->data;
      local_158.refcount = top_blob->refcount;
      local_158.elemsize = top_blob->elemsize;
      local_158.elempack = top_blob->elempack;
      local_158.allocator = top_blob->allocator;
      local_158.dims = top_blob->dims;
      local_158.w = top_blob->w;
      local_158.h = top_blob->h;
      local_158.d = top_blob->d;
      local_158.c = top_blob->c;
      local_158.cstep = top_blob->cstep;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      if (uVar23 < uVar24) {
        Mat::create(&local_158,uVar32,iVar30 + 1,
                    (this->super_ConvolutionDepthWise).num_output / (int)uVar23,
                    (ulong)uVar23 * (_elemsize / uVar39),uVar23,opt->workspace_allocator);
        iVar19 = -100;
        if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0))
        goto LAB_003fe434;
      }
      else {
LAB_003fe434:
        if (0 < (this->super_ConvolutionDepthWise).group) {
          local_208 = (int)uVar22;
          iVar30 = 0;
          iVar21 = 0;
          lVar37 = 0;
          do {
            local_c0 = (_func_int ***)
                       ((long)(_func_int ***)local_1a8.data +
                       (long)(iVar30 / iVar18) * local_1a8.cstep * local_1a8.elemsize);
            local_b8 = (int *)0x0;
            local_b0 = local_1a8.elemsize;
            local_a8 = local_1a8.elempack;
            local_a0 = local_1a8.allocator;
            local_80 = ((long)local_1a8.d * local_1a8.elemsize *
                        (long)local_1a8.h * (long)local_1a8.w + 0xf & 0xfffffffffffffff0) /
                       local_1a8.elemsize;
            local_98 = local_1a8.dims;
            iStack_94 = local_1a8.w;
            iStack_90 = local_1a8.h;
            iStack_8c = local_1a8.d;
            local_108 = (void *)((long)(iVar21 / (int)uVar23) * local_158.cstep * local_158.elemsize
                                + (long)local_158.data);
            local_100 = (int *)0x0;
            local_f8 = (Allocator *)local_158.elemsize;
            local_f0 = local_158.elempack;
            local_e8 = local_158.allocator;
            local_c8 = ((long)local_158.d * local_158.elemsize *
                        (long)local_158.h * (long)local_158.w + 0xf & 0xfffffffffffffff0) /
                       local_158.elemsize;
            local_e0 = local_158.dims;
            iStack_dc = local_158.w;
            iStack_d8 = local_158.h;
            iStack_d4 = local_158.d;
            pLVar4 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar37];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            uStack_58._0_1_ = opt->use_bf16_storage;
            uStack_58._1_1_ = opt->use_fp16_packed;
            uStack_58._2_1_ = opt->use_fp16_storage;
            uStack_58._3_1_ = opt->use_fp16_arithmetic;
            uStack_58._4_1_ = opt->use_int8_packed;
            uStack_58._5_1_ = opt->use_int8_storage;
            uStack_58._6_1_ = opt->use_int8_arithmetic;
            uStack_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = local_158.allocator;
            local_d0 = local_208 / (int)uVar23;
            local_88 = (int)uVar26 / iVar18;
            iVar19 = (*pLVar4->_vptr_Layer[7])(pLVar4,&local_c0,&local_108,&local_78);
            if (local_100 != (int *)0x0) {
              LOCK();
              *local_100 = *local_100 + -1;
              UNLOCK();
              if (*local_100 == 0) {
                if (local_e8 == (Allocator *)0x0) {
                  if (local_108 != (void *)0x0) {
                    free(local_108);
                  }
                }
                else {
                  (*local_e8->_vptr_Allocator[3])();
                }
              }
            }
            if (local_b8 != (int *)0x0) {
              LOCK();
              *local_b8 = *local_b8 + -1;
              UNLOCK();
              if (*local_b8 == 0) {
                if (local_a0 == (Allocator *)0x0) {
                  if (local_c0 != (_func_int ***)0x0) {
                    free(local_c0);
                  }
                }
                else {
                  (*local_a0->_vptr_Allocator[3])();
                }
              }
            }
            if (iVar19 != 0) goto LAB_003fea0e;
            lVar37 = lVar37 + 1;
            iVar21 = iVar21 + local_208;
            iVar30 = iVar30 + (int)uVar26;
          } while (lVar37 < (this->super_ConvolutionDepthWise).group);
        }
        if (uVar23 < uVar24) {
          convert_packing(&local_158,top_blob,uVar24,opt);
          iVar19 = -100;
          if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
          goto LAB_003fea0e;
        }
        else if (&local_158 != top_blob) {
          if ((Allocator *)local_158.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_158.refcount =
                 *(int *)(_func_int ***)local_158.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_158.data;
          top_blob->refcount = local_158.refcount;
          top_blob->elemsize = local_158.elemsize;
          top_blob->elempack = local_158.elempack;
          top_blob->allocator = local_158.allocator;
          top_blob->dims = local_158.dims;
          top_blob->w = local_158.w;
          top_blob->h = local_158.h;
          top_blob->d = local_158.d;
          top_blob->c = local_158.c;
          top_blob->cstep = local_158.cstep;
        }
        iVar19 = 0;
      }
LAB_003fea0e:
      if ((Allocator *)local_158.refcount != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_158.refcount = *(int *)(_func_int ***)local_158.refcount + -1;
        UNLOCK();
        if (*(int *)(_func_int ***)local_158.refcount == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (local_1a8.refcount != (int *)0x0) {
      LOCK();
      *local_1a8.refcount = *local_1a8.refcount + -1;
      UNLOCK();
      if (*local_1a8.refcount == 0) {
        if (local_1a8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
            free(local_1a8.data);
          }
        }
        else {
          (*(local_1a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_003fea86;
  }
  if (iVar33 < 8) {
    if (iVar33 == 1) {
      auVar54._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
      auVar54._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
      auVar54._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
      auVar54._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
      uVar26 = vpcmpd_avx512vl(auVar54,_DAT_005c3380,4);
      iVar18 = (this->super_ConvolutionDepthWise).stride_w;
      uVar2 = (this->super_ConvolutionDepthWise).stride_h;
      if ((uVar2 == 1 && iVar18 == 1) && (uVar26 & 0xf) == 0) {
        convdw3x3s1_sse(&local_1f8,top_blob,(Mat *)(this->weight_data_tm).data,
                        (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                        (Option *)(ulong)uVar2);
      }
      else {
        bVar41 = (uVar26 & 0xf) == 0;
        if ((uVar2 != 2 || iVar18 != 2) || !bVar41) goto LAB_003fe1f0;
        convdw3x3s2_sse(&local_1f8,top_blob,(Mat *)(this->weight_data_tm).data,
                        (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                        (Option *)
                        (ulong)CONCAT31((int3)(uVar2 >> 8),(uVar2 == 2 && iVar18 == 2) && bVar41));
      }
    }
    else {
      if (iVar33 != 4) goto LAB_003fe1f0;
      uVar2 = (this->super_ConvolutionDepthWise).kernel_w;
      uVar24 = (this->super_ConvolutionDepthWise).kernel_h;
      uVar27 = (this->super_ConvolutionDepthWise).dilation_w ^ 1;
      uVar34 = (this->super_ConvolutionDepthWise).dilation_h ^ 1;
      uVar35 = uVar24 ^ 3 | uVar2 ^ 3 | uVar27 | uVar34;
      bVar41 = uVar35 == 0;
      uVar16 = (undefined3)(uVar35 >> 8);
      iVar21 = (this->super_ConvolutionDepthWise).stride_w;
      iVar29 = (this->super_ConvolutionDepthWise).stride_h;
      if ((iVar29 == 1 && iVar21 == 1) && bVar41) {
        convdw3x3s1_pack4_sse
                  (&local_1f8,top_blob,&this->weight_data_tm,
                   (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                   (Option *)(ulong)CONCAT31(uVar16,bVar41));
      }
      else if (bVar41 && (iVar29 == 2 && iVar21 == 2)) {
        convdw3x3s2_pack4_sse
                  (&local_1f8,top_blob,&this->weight_data_tm,
                   (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                   (Option *)(ulong)CONCAT31(uVar16,bVar41 && (iVar29 == 2 && iVar21 == 2)));
      }
      else {
        pOVar36 = (Option *)(ulong)CONCAT31(uVar16,iVar29 == 1);
        bVar41 = uVar24 != 5 || uVar2 != 5;
        if ((iVar21 != 1 || iVar29 != 1) || ((bVar41 || uVar27 != 0) || uVar34 != 0)) {
          if (((bVar41 || uVar27 != 0) || uVar34 != 0) || (iVar21 != 2 || iVar29 != 2)) {
            uVar24 = uVar24 * uVar2;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_1a8,(long)(int)uVar24,
                       (allocator_type *)&local_158);
            iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
            if (0 < iVar21) {
              iVar29 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar19 = (this->super_ConvolutionDepthWise).dilation_w * iVar33;
              iVar20 = 0;
              iVar25 = 0;
              iVar28 = 0;
              do {
                if (0 < iVar33) {
                  lVar37 = 0;
                  do {
                    *(int *)((long)(_func_int ***)local_1a8.data + lVar37 * 4 + (long)iVar28 * 4) =
                         iVar25;
                    iVar25 = iVar25 + (this->super_ConvolutionDepthWise).dilation_w;
                    iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
                    lVar37 = lVar37 + 1;
                  } while ((int)lVar37 < iVar33);
                  iVar28 = iVar28 + (int)lVar37;
                  iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
                }
                iVar25 = iVar25 + (iVar17 * iVar29 - iVar19);
                iVar20 = iVar20 + 1;
              } while (iVar20 < iVar21);
            }
            if (0 < (int)uVar23) {
              iVar21 = 0;
              auVar69._8_4_ = 0x42b0c0a5;
              auVar69._0_8_ = 0x42b0c0a542b0c0a5;
              auVar69._12_4_ = 0x42b0c0a5;
              auVar70._8_4_ = 0xc2b0c0a5;
              auVar70._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar70._12_4_ = 0xc2b0c0a5;
              auVar71._8_4_ = 0x3f000000;
              auVar71._0_8_ = 0x3f0000003f000000;
              auVar71._12_4_ = 0x3f000000;
              auVar72._8_4_ = 0x3fb8aa3b;
              auVar72._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar72._12_4_ = 0x3fb8aa3b;
              auVar73._8_4_ = 0x3f800000;
              auVar73._0_8_ = 0x3f8000003f800000;
              auVar73._12_4_ = 0x3f800000;
              auVar74._8_4_ = 0x3f318000;
              auVar74._0_8_ = 0x3f3180003f318000;
              auVar74._12_4_ = 0x3f318000;
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
              auVar81._8_4_ = 0x3ab743ce;
              auVar81._0_8_ = 0x3ab743ce3ab743ce;
              auVar81._12_4_ = 0x3ab743ce;
              auVar82._8_4_ = 0x3c088908;
              auVar82._0_8_ = 0x3c0889083c088908;
              auVar82._12_4_ = 0x3c088908;
              auVar83._8_4_ = 0x3d2aa9c1;
              auVar83._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar83._12_4_ = 0x3d2aa9c1;
              auVar84._8_4_ = 0x3e2aaaaa;
              auVar84._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar84._12_4_ = 0x3e2aaaaa;
              auVar85._8_4_ = 0x3f800000;
              auVar85._0_8_ = 0x3f8000003f800000;
              auVar85._12_4_ = 0x3f800000;
              auVar86._8_4_ = 0xb95e8083;
              auVar86._0_8_ = 0xb95e8083b95e8083;
              auVar86._12_4_ = 0xb95e8083;
              auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
              auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
              auVar48 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
              auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
              auVar54 = vxorps_avx512vl(auVar54,auVar54);
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
              local_218 = 0;
              do {
                if (-1 < iVar30) {
                  pvVar31 = (void *)(top_blob->cstep * local_218 * top_blob->elemsize +
                                    (long)top_blob->data);
                  pvVar5 = (this->weight_data_tm).data;
                  iVar29 = 0;
                  do {
                    if (-1 < iVar18) {
                      uVar26 = 0;
                      do {
                        if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                          auVar63 = ZEXT816(0) << 0x40;
                        }
                        else {
                          auVar63 = *(undefined1 (*) [16])
                                     ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                                     local_218 * 0x10);
                        }
                        if (0 < (int)uVar24) {
                          lVar37 = 0;
                          do {
                            auVar63 = vfmadd231ps_fma(auVar63,*(undefined1 (*) [16])
                                                               ((long)pvVar5 +
                                                               lVar37 * 4 + (long)iVar21 * 4),
                                                      *(undefined1 (*) [16])
                                                       ((long)&((Allocator *)
                                                               ((long)local_1f8.data +
                                                               (long)*(int *)((long)(_func_int ***)
                                                                                    local_1a8.data +
                                                                             lVar37) * 2 * 8))->
                                                               _vptr_Allocator +
                                                       (long)((this->super_ConvolutionDepthWise).
                                                              stride_w * (int)uVar26 * 4) * 4 +
                                                       (long)(this->super_ConvolutionDepthWise).
                                                             stride_h * (long)iVar29 *
                                                       (long)local_1f8.w * local_1f8.elemsize +
                                                       local_1f8.cstep * local_218 *
                                                       local_1f8.elemsize));
                            lVar37 = lVar37 + 4;
                          } while ((ulong)uVar24 << 2 != lVar37);
                        }
                        auVar65 = auVar63;
                        switch((this->super_ConvolutionDepthWise).activation_type) {
                        case 1:
                          auVar65 = vmaxps_avx512vl(auVar63,auVar54);
                          break;
                        case 2:
                          auVar65 = vmaxps_avx512vl(auVar63,auVar54);
                          auVar63 = vminps_avx512vl(auVar63,auVar54);
                          uVar1 = *(this->super_ConvolutionDepthWise).activation_params.data;
                          auVar15._4_4_ = uVar1;
                          auVar15._0_4_ = uVar1;
                          auVar15._8_4_ = uVar1;
                          auVar15._12_4_ = uVar1;
                          auVar65 = vfmadd132ps_avx512vl(auVar63,auVar65,auVar15);
                          break;
                        case 3:
                          puVar6 = (undefined4 *)
                                   (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar1 = *puVar6;
                          auVar13._4_4_ = uVar1;
                          auVar13._0_4_ = uVar1;
                          auVar13._8_4_ = uVar1;
                          auVar13._12_4_ = uVar1;
                          auVar63 = vmaxps_avx512vl(auVar63,auVar13);
                          uVar1 = puVar6[1];
                          auVar14._4_4_ = uVar1;
                          auVar14._0_4_ = uVar1;
                          auVar14._8_4_ = uVar1;
                          auVar14._12_4_ = uVar1;
                          auVar65 = vminps_avx512vl(auVar63,auVar14);
                          break;
                        case 4:
                          auVar11._8_4_ = 0x80000000;
                          auVar11._0_8_ = 0x8000000080000000;
                          auVar11._12_4_ = 0x80000000;
                          auVar63 = vxorps_avx512vl(auVar63,auVar11);
                          auVar63 = vminps_avx(auVar63,auVar69);
                          auVar65 = vmaxps_avx(auVar63,auVar70);
                          auVar58 = vfmadd231ps_fma(auVar71,auVar65,auVar72);
                          auVar90._0_4_ = (int)auVar58._0_4_;
                          auVar90._4_4_ = (int)auVar58._4_4_;
                          auVar90._8_4_ = (int)auVar58._8_4_;
                          auVar90._12_4_ = (int)auVar58._12_4_;
                          auVar63 = vcvtdq2ps_avx(auVar90);
                          uVar39 = vcmpps_avx512vl(auVar58,auVar63,1);
                          auVar58 = vsubps_avx512vl(auVar63,auVar73);
                          bVar41 = (bool)((byte)uVar39 & 1);
                          auVar64._0_4_ =
                               (float)((uint)bVar41 * auVar58._0_4_ | (uint)!bVar41 * auVar63._0_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
                          auVar64._4_4_ =
                               (float)((uint)bVar41 * auVar58._4_4_ | (uint)!bVar41 * auVar63._4_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
                          auVar64._8_4_ =
                               (float)((uint)bVar41 * auVar58._8_4_ | (uint)!bVar41 * auVar63._8_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
                          auVar64._12_4_ =
                               (float)((uint)bVar41 * auVar58._12_4_ |
                                      (uint)!bVar41 * auVar63._12_4_);
                          auVar63 = vfmsub231ps_fma(auVar65,auVar64,auVar74);
                          auVar12._8_4_ = 0x395e8083;
                          auVar12._0_8_ = 0x395e8083395e8083;
                          auVar12._12_4_ = 0x395e8083;
                          auVar65 = vfmsub231ps_avx512vl(auVar63,auVar64,auVar12);
                          auVar76._0_4_ = auVar65._0_4_ * auVar65._0_4_;
                          auVar76._4_4_ = auVar65._4_4_ * auVar65._4_4_;
                          auVar76._8_4_ = auVar65._8_4_ * auVar65._8_4_;
                          auVar76._12_4_ = auVar65._12_4_ * auVar65._12_4_;
                          auVar63 = vfmadd213ps_fma(auVar42,auVar65,auVar81);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar65,auVar82);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar65,auVar83);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar65,auVar84);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar65,auVar71);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar76,auVar65);
                          auVar67._0_4_ = auVar63._0_4_ + 1.0;
                          auVar67._4_4_ = auVar63._4_4_ + 1.0;
                          auVar67._8_4_ = auVar63._8_4_ + 1.0;
                          auVar67._12_4_ = auVar63._12_4_ + 1.0;
                          auVar63._0_4_ = (int)auVar64._0_4_;
                          auVar63._4_4_ = (int)auVar64._4_4_;
                          auVar63._8_4_ = (int)auVar64._8_4_;
                          auVar63._12_4_ = (int)auVar64._12_4_;
                          auVar63 = vpslld_avx(auVar63,0x17);
                          auVar63 = vpaddd_avx(auVar85,auVar63);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar67,auVar73);
                          auVar65 = vdivps_avx(auVar73,auVar63);
                          break;
                        case 5:
                          auVar65 = vminps_avx(auVar63,auVar69);
                          auVar58 = vmaxps_avx(auVar65,auVar70);
                          auVar56 = vfmadd213ps_fma(auVar72,auVar58,auVar71);
                          auVar87._0_4_ = (int)auVar56._0_4_;
                          auVar87._4_4_ = (int)auVar56._4_4_;
                          auVar87._8_4_ = (int)auVar56._8_4_;
                          auVar87._12_4_ = (int)auVar56._12_4_;
                          auVar65 = vcvtdq2ps_avx(auVar87);
                          uVar39 = vcmpps_avx512vl(auVar56,auVar65,1);
                          auVar56 = vsubps_avx512vl(auVar65,auVar73);
                          bVar41 = (bool)((byte)uVar39 & 1);
                          auVar57._0_4_ =
                               (float)((uint)bVar41 * auVar56._0_4_ | (uint)!bVar41 * auVar65._0_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
                          auVar57._4_4_ =
                               (float)((uint)bVar41 * auVar56._4_4_ | (uint)!bVar41 * auVar65._4_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
                          auVar57._8_4_ =
                               (float)((uint)bVar41 * auVar56._8_4_ | (uint)!bVar41 * auVar65._8_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
                          auVar57._12_4_ =
                               (float)((uint)bVar41 * auVar56._12_4_ |
                                      (uint)!bVar41 * auVar65._12_4_);
                          auVar65 = vfmsub231ps_fma(auVar58,auVar57,auVar74);
                          auVar65 = vfnmsub231ps_fma(auVar65,auVar57,auVar86);
                          auVar77._0_4_ = auVar65._0_4_ * auVar65._0_4_;
                          auVar77._4_4_ = auVar65._4_4_ * auVar65._4_4_;
                          auVar77._8_4_ = auVar65._8_4_ * auVar65._8_4_;
                          auVar77._12_4_ = auVar65._12_4_ * auVar65._12_4_;
                          auVar58 = vfmadd213ps_avx512vl(auVar42,auVar65,auVar81);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar65,auVar82);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar65,auVar83);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar65,auVar84);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar65,auVar71);
                          auVar65 = vfmadd213ps_avx512vl(auVar58,auVar77,auVar65);
                          auVar58 = vaddps_avx512vl(auVar65,auVar73);
                          auVar78._0_4_ = (int)auVar57._0_4_;
                          auVar78._4_4_ = (int)auVar57._4_4_;
                          auVar78._8_4_ = (int)auVar57._8_4_;
                          auVar78._12_4_ = (int)auVar57._12_4_;
                          auVar65 = vpslld_avx(auVar78,0x17);
                          auVar65 = vpaddd_avx(auVar65,auVar85);
                          auVar65 = vfmadd213ps_fma(auVar65,auVar58,auVar73);
                          uVar39 = vcmpps_avx512vl(auVar65,auVar54,2);
                          auVar8._8_4_ = 0x800000;
                          auVar8._0_8_ = 0x80000000800000;
                          auVar8._12_4_ = 0x800000;
                          auVar65 = vmaxps_avx512vl(auVar65,auVar8);
                          auVar56 = vpsrld_avx(auVar65,0x17);
                          auVar88._8_4_ = 0x807fffff;
                          auVar88._0_8_ = 0x807fffff807fffff;
                          auVar88._12_4_ = 0x807fffff;
                          auVar9._8_4_ = 0x3f000000;
                          auVar9._0_8_ = 0x3f0000003f000000;
                          auVar9._12_4_ = 0x3f000000;
                          auVar65 = vpternlogd_avx512vl(auVar65,auVar88,auVar9,0xea);
                          uVar7 = vcmpps_avx512vl(auVar65,auVar43,1);
                          auVar58 = vaddps_avx512vl(auVar65,auVar44);
                          auVar65 = vaddps_avx512vl(auVar58,auVar65);
                          bVar41 = (bool)((byte)uVar7 & 1);
                          auVar59._0_4_ =
                               (float)((uint)bVar41 * auVar65._0_4_ | (uint)!bVar41 * auVar58._0_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar7 >> 1) & 1);
                          auVar59._4_4_ =
                               (float)((uint)bVar41 * auVar65._4_4_ | (uint)!bVar41 * auVar58._4_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar7 >> 2) & 1);
                          auVar59._8_4_ =
                               (float)((uint)bVar41 * auVar65._8_4_ | (uint)!bVar41 * auVar58._8_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar7 >> 3) & 1);
                          auVar59._12_4_ =
                               (float)((uint)bVar41 * auVar65._12_4_ |
                                      (uint)!bVar41 * auVar58._12_4_);
                          auVar75._0_4_ = auVar59._0_4_ * auVar59._0_4_;
                          auVar75._4_4_ = auVar59._4_4_ * auVar59._4_4_;
                          auVar75._8_4_ = auVar59._8_4_ * auVar59._8_4_;
                          auVar75._12_4_ = auVar59._12_4_ * auVar59._12_4_;
                          auVar65 = vfmadd213ps_avx512vl(auVar45,auVar59,auVar46);
                          auVar65 = vfmadd213ps_avx512vl(auVar65,auVar59,auVar47);
                          auVar65 = vfmadd213ps_avx512vl(auVar65,auVar59,auVar48);
                          auVar65 = vfmadd213ps_avx512vl(auVar65,auVar59,auVar49);
                          auVar65 = vfmadd213ps_avx512vl(auVar65,auVar59,auVar50);
                          auVar65 = vfmadd213ps_avx512vl(auVar65,auVar59,auVar51);
                          auVar65 = vfmadd213ps_avx512vl(auVar65,auVar59,auVar52);
                          auVar65 = vfmadd213ps_avx512vl(auVar65,auVar59,auVar53);
                          auVar58 = vmulps_avx512vl(auVar75,auVar59);
                          auVar58 = vmulps_avx512vl(auVar58,auVar65);
                          auVar10._8_4_ = 0xffffff82;
                          auVar10._0_8_ = 0xffffff82ffffff82;
                          auVar10._12_4_ = 0xffffff82;
                          auVar65 = vpaddd_avx512vl(auVar56,auVar10);
                          auVar65 = vcvtdq2ps_avx(auVar65);
                          auVar56 = vsubps_avx512vl(auVar65,auVar73);
                          bVar41 = (bool)((byte)uVar7 & 1);
                          auVar60._0_4_ =
                               (uint)bVar41 * auVar56._0_4_ | (uint)!bVar41 * auVar65._0_4_;
                          bVar41 = (bool)((byte)(uVar7 >> 1) & 1);
                          auVar60._4_4_ =
                               (uint)bVar41 * auVar56._4_4_ | (uint)!bVar41 * auVar65._4_4_;
                          bVar41 = (bool)((byte)(uVar7 >> 2) & 1);
                          auVar60._8_4_ =
                               (uint)bVar41 * auVar56._8_4_ | (uint)!bVar41 * auVar65._8_4_;
                          bVar41 = (bool)((byte)(uVar7 >> 3) & 1);
                          auVar60._12_4_ =
                               (uint)bVar41 * auVar56._12_4_ | (uint)!bVar41 * auVar65._12_4_;
                          auVar65 = vfmadd231ps_avx512vl(auVar58,auVar60,auVar86);
                          auVar65 = vfmsub231ps_avx512vl(auVar65,auVar71,auVar75);
                          auVar65 = vsubps_avx512vl(auVar65,auVar59);
                          auVar65 = vfnmadd231ps_fma(auVar65,auVar74,auVar60);
                          auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          bVar41 = (bool)((byte)uVar39 & 1);
                          auVar61._0_4_ =
                               (uint)bVar41 * auVar58._0_4_ |
                               (uint)!bVar41 * (int)(auVar65._0_4_ + auVar65._0_4_);
                          bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
                          auVar61._4_4_ =
                               (uint)bVar41 * auVar58._4_4_ |
                               (uint)!bVar41 * (int)(auVar65._4_4_ + auVar65._4_4_);
                          bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
                          auVar61._8_4_ =
                               (uint)bVar41 * auVar58._8_4_ |
                               (uint)!bVar41 * (int)(auVar65._8_4_ + auVar65._8_4_);
                          bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
                          auVar61._12_4_ =
                               (uint)bVar41 * auVar58._12_4_ |
                               (uint)!bVar41 * (int)(auVar65._12_4_ + auVar65._12_4_);
                          auVar65 = vminps_avx(auVar61,auVar69);
                          auVar58 = vmaxps_avx(auVar65,auVar70);
                          auVar56 = vfmadd213ps_fma(auVar72,auVar58,auVar71);
                          auVar89._0_4_ = (int)auVar56._0_4_;
                          auVar89._4_4_ = (int)auVar56._4_4_;
                          auVar89._8_4_ = (int)auVar56._8_4_;
                          auVar89._12_4_ = (int)auVar56._12_4_;
                          auVar65 = vcvtdq2ps_avx(auVar89);
                          uVar39 = vcmpps_avx512vl(auVar56,auVar65,1);
                          auVar56 = vsubps_avx512vl(auVar65,auVar73);
                          bVar41 = (bool)((byte)uVar39 & 1);
                          auVar62._0_4_ =
                               (float)((uint)bVar41 * auVar56._0_4_ | (uint)!bVar41 * auVar65._0_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
                          auVar62._4_4_ =
                               (float)((uint)bVar41 * auVar56._4_4_ | (uint)!bVar41 * auVar65._4_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
                          auVar62._8_4_ =
                               (float)((uint)bVar41 * auVar56._8_4_ | (uint)!bVar41 * auVar65._8_4_)
                          ;
                          bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
                          auVar62._12_4_ =
                               (float)((uint)bVar41 * auVar56._12_4_ |
                                      (uint)!bVar41 * auVar65._12_4_);
                          auVar65 = vfmsub231ps_fma(auVar58,auVar62,auVar74);
                          auVar65 = vfnmsub231ps_fma(auVar65,auVar62,auVar86);
                          auVar79._0_4_ = auVar65._0_4_ * auVar65._0_4_;
                          auVar79._4_4_ = auVar65._4_4_ * auVar65._4_4_;
                          auVar79._8_4_ = auVar65._8_4_ * auVar65._8_4_;
                          auVar79._12_4_ = auVar65._12_4_ * auVar65._12_4_;
                          auVar58 = vfmadd213ps_avx512vl(auVar42,auVar65,auVar81);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar65,auVar82);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar65,auVar83);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar65,auVar84);
                          auVar58 = vfmadd213ps_avx512vl(auVar58,auVar65,auVar71);
                          auVar65 = vfmadd213ps_avx512vl(auVar58,auVar79,auVar65);
                          auVar58 = vaddps_avx512vl(auVar65,auVar73);
                          auVar80._0_4_ = (int)auVar62._0_4_;
                          auVar80._4_4_ = (int)auVar62._4_4_;
                          auVar80._8_4_ = (int)auVar62._8_4_;
                          auVar80._12_4_ = (int)auVar62._12_4_;
                          auVar65 = vpslld_avx(auVar80,0x17);
                          auVar65 = vpaddd_avx(auVar65,auVar85);
                          auVar65 = vfmadd213ps_fma(auVar65,auVar58,auVar73);
                          auVar65 = vdivps_avx512vl(auVar55,auVar65);
                          auVar65 = vfmsub231ps_fma(auVar63,auVar63,auVar65);
                          break;
                        case 6:
                          puVar6 = (undefined4 *)
                                   (this->super_ConvolutionDepthWise).activation_params.data;
                          uVar1 = *puVar6;
                          auVar56._4_4_ = uVar1;
                          auVar56._0_4_ = uVar1;
                          auVar56._8_4_ = uVar1;
                          auVar56._12_4_ = uVar1;
                          uVar1 = puVar6[1];
                          auVar58._4_4_ = uVar1;
                          auVar58._0_4_ = uVar1;
                          auVar58._8_4_ = uVar1;
                          auVar58._12_4_ = uVar1;
                          auVar65 = vfmadd213ps_avx512vl(auVar56,auVar63,auVar58);
                          auVar65 = vmaxps_avx512vl(auVar65,auVar54);
                          auVar58 = vminps_avx(auVar65,auVar73);
                          auVar65._0_4_ = auVar58._0_4_ * auVar63._0_4_;
                          auVar65._4_4_ = auVar58._4_4_ * auVar63._4_4_;
                          auVar65._8_4_ = auVar58._8_4_ * auVar63._8_4_;
                          auVar65._12_4_ = auVar58._12_4_ * auVar63._12_4_;
                        }
                        *(undefined1 (*) [16])((long)pvVar31 + uVar26 * 0x10) = auVar65;
                        uVar26 = uVar26 + 1;
                      } while (uVar26 != uVar32);
                    }
                    pvVar31 = (void *)((long)pvVar31 + (long)(int)(uVar32 * 4) * 4);
                    bVar41 = iVar29 != iVar30;
                    iVar29 = iVar29 + 1;
                  } while (bVar41);
                }
                local_218 = local_218 + 1;
                iVar21 = iVar21 + uVar24 * 4;
              } while (local_218 != uVar22);
            }
            goto LAB_003ff52f;
          }
          convdw5x5s2_pack4_sse
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar36);
        }
        else {
          convdw5x5s1_pack4_sse
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar36);
        }
      }
    }
LAB_003fe984:
    pLVar4 = this->activation;
    if (pLVar4 != (Layer *)0x0) {
      (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
    }
  }
  else {
    if (iVar33 != 8) {
      if (iVar33 != 0x10) goto LAB_003fe1f0;
      uVar2 = (this->super_ConvolutionDepthWise).kernel_w;
      uVar32 = (this->super_ConvolutionDepthWise).kernel_h;
      uVar24 = (this->super_ConvolutionDepthWise).dilation_w ^ 1;
      uVar27 = (this->super_ConvolutionDepthWise).dilation_h ^ 1;
      uVar34 = uVar32 ^ 3 | uVar2 ^ 3 | uVar24 | uVar27;
      bVar41 = uVar34 == 0;
      uVar16 = (undefined3)(uVar34 >> 8);
      iVar21 = (this->super_ConvolutionDepthWise).stride_w;
      iVar29 = (this->super_ConvolutionDepthWise).stride_h;
      if ((iVar29 == 1 && iVar21 == 1) && bVar41) {
        convdw3x3s1_pack16_avx512
                  (&local_1f8,top_blob,&this->weight_data_tm,
                   (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                   (Option *)(ulong)CONCAT31(uVar16,bVar41));
      }
      else if (bVar41 && (iVar29 == 2 && iVar21 == 2)) {
        convdw3x3s2_pack16_avx512
                  (&local_1f8,top_blob,&this->weight_data_tm,
                   (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                   (Option *)(ulong)CONCAT31(uVar16,bVar41 && (iVar29 == 2 && iVar21 == 2)));
      }
      else {
        pOVar36 = (Option *)(ulong)CONCAT31(uVar16,iVar29 == 1);
        bVar41 = uVar32 != 5 || uVar2 != 5;
        if ((iVar21 != 1 || iVar29 != 1) || ((bVar41 || uVar24 != 0) || uVar27 != 0)) {
          if (((bVar41 || uVar24 != 0) || uVar27 != 0) || (iVar21 != 2 || iVar29 != 2)) {
            uVar32 = uVar32 * uVar2;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_1a8,(long)(int)uVar32,
                       (allocator_type *)&local_158);
            iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
            if (0 < iVar21) {
              iVar29 = (this->super_ConvolutionDepthWise).dilation_h;
              iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar19 = (this->super_ConvolutionDepthWise).dilation_w * iVar33;
              iVar20 = 0;
              iVar25 = 0;
              iVar28 = 0;
              do {
                if (0 < iVar33) {
                  lVar37 = 0;
                  do {
                    *(int *)((long)(_func_int ***)local_1a8.data + lVar37 * 4 + (long)iVar20 * 4) =
                         iVar25;
                    iVar25 = iVar25 + (this->super_ConvolutionDepthWise).dilation_w;
                    iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
                    lVar37 = lVar37 + 1;
                  } while ((int)lVar37 < iVar33);
                  iVar20 = iVar20 + (int)lVar37;
                  iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
                }
                iVar25 = iVar25 + (iVar17 * iVar29 - iVar19);
                iVar28 = iVar28 + 1;
              } while (iVar28 < iVar21);
            }
            if (0 < (int)uVar23) {
              iVar21 = 0;
              local_240 = 0;
              do {
                if (-1 < iVar30) {
                  pauVar40 = (undefined1 (*) [64])
                             (top_blob->cstep * local_240 * top_blob->elemsize +
                             (long)top_blob->data);
                  pvVar31 = (this->weight_data_tm).data;
                  iVar29 = 0;
                  do {
                    if (-1 < iVar18) {
                      iVar33 = 0;
                      do {
                        if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                          auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar66 = *(undefined1 (*) [64])
                                     ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                                     local_240 * 0x40);
                        }
                        if (0 < (int)uVar32) {
                          uVar26 = 0;
                          pauVar38 = (undefined1 (*) [64])((long)iVar21 * 4 + (long)pvVar31);
                          do {
                            auVar66 = vfmadd231ps_avx512f(auVar66,*(undefined1 (*) [64])
                                                                   ((long)&((Allocator *)
                                                                           ((long)local_1f8.data +
                                                                           (long)*(int *)((long)(
                                                  _func_int ***)local_1a8.data + uVar26 * 4) * 8 * 8
                                                  ))->_vptr_Allocator +
                                                  (long)((this->super_ConvolutionDepthWise).stride_w
                                                         * iVar33 * 0x10) * 4 +
                                                  (long)(this->super_ConvolutionDepthWise).stride_h
                                                  * (long)iVar29 *
                                                  (long)local_1f8.w * local_1f8.elemsize +
                                                  local_1f8.cstep * local_240 * local_1f8.elemsize),
                                                  *pauVar38);
                            uVar26 = uVar26 + 1;
                            pauVar38 = pauVar38 + 1;
                          } while (uVar32 != uVar26);
                        }
                        *pauVar40 = auVar66;
                        pauVar40 = pauVar40 + 1;
                        bVar41 = iVar33 != iVar18;
                        iVar33 = iVar33 + 1;
                      } while (bVar41);
                    }
                    bVar41 = iVar29 != iVar30;
                    iVar29 = iVar29 + 1;
                  } while (bVar41);
                }
                local_240 = local_240 + 1;
                iVar21 = iVar21 + uVar32 * 0x10;
              } while (local_240 != uVar22);
            }
            pLVar4 = this->activation;
            if (pLVar4 != (Layer *)0x0) {
              (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
            }
            goto LAB_003ff52f;
          }
          convdw5x5s2_pack16_avx512
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar36);
        }
        else {
          convdw5x5s1_pack16_avx512
                    (&local_1f8,top_blob,&this->weight_data_tm,
                     (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar36);
        }
      }
      goto LAB_003fe984;
    }
    uVar2 = (this->super_ConvolutionDepthWise).kernel_w;
    uVar24 = (this->super_ConvolutionDepthWise).kernel_h;
    uVar27 = (this->super_ConvolutionDepthWise).dilation_w ^ 1;
    uVar34 = (this->super_ConvolutionDepthWise).dilation_h ^ 1;
    uVar35 = uVar24 ^ 3 | uVar2 ^ 3 | uVar27 | uVar34;
    bVar41 = uVar35 == 0;
    uVar16 = (undefined3)(uVar35 >> 8);
    iVar21 = (this->super_ConvolutionDepthWise).stride_w;
    iVar29 = (this->super_ConvolutionDepthWise).stride_h;
    if ((iVar29 == 1 && iVar21 == 1) && bVar41) {
      convdw3x3s1_pack8_avx
                (&local_1f8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                 (Option *)(ulong)CONCAT31(uVar16,bVar41));
      goto LAB_003fe984;
    }
    if (bVar41 && (iVar29 == 2 && iVar21 == 2)) {
      convdw3x3s2_pack8_avx
                (&local_1f8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                 (Option *)(ulong)CONCAT31(uVar16,bVar41 && (iVar29 == 2 && iVar21 == 2)));
      goto LAB_003fe984;
    }
    pOVar36 = (Option *)(ulong)CONCAT31(uVar16,iVar29 == 1);
    if ((iVar21 == 1 && iVar29 == 1) &&
        (((uVar24 == 5 && uVar2 == 5) && uVar27 == 0) && uVar34 == 0)) {
      convdw5x5s1_pack8_avx
                (&local_1f8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar36);
      goto LAB_003fe984;
    }
    if ((((uVar24 == 5 && uVar2 == 5) && uVar27 == 0) && uVar34 == 0) &&
        (iVar21 == 2 && iVar29 == 2)) {
      convdw5x5s2_pack8_avx
                (&local_1f8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar36);
      goto LAB_003fe984;
    }
    uVar24 = uVar24 * uVar2;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_1a8,(long)(int)uVar24,
               (allocator_type *)&local_158);
    iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
    if (0 < iVar21) {
      iVar29 = (this->super_ConvolutionDepthWise).dilation_h;
      iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
      iVar19 = (this->super_ConvolutionDepthWise).dilation_w * iVar33;
      iVar20 = 0;
      iVar25 = 0;
      iVar28 = 0;
      do {
        if (0 < iVar33) {
          lVar37 = 0;
          do {
            *(int *)((long)(_func_int ***)local_1a8.data + lVar37 * 4 + (long)iVar28 * 4) = iVar25;
            iVar25 = iVar25 + (this->super_ConvolutionDepthWise).dilation_w;
            iVar33 = (this->super_ConvolutionDepthWise).kernel_w;
            lVar37 = lVar37 + 1;
          } while ((int)lVar37 < iVar33);
          iVar28 = iVar28 + (int)lVar37;
          iVar21 = (this->super_ConvolutionDepthWise).kernel_h;
        }
        iVar25 = iVar25 + (iVar17 * iVar29 - iVar19);
        iVar20 = iVar20 + 1;
      } while (iVar20 < iVar21);
    }
    if (0 < (int)uVar23) {
      iVar21 = 0;
      local_218 = 0;
      do {
        if (-1 < iVar30) {
          pvVar31 = (void *)(top_blob->cstep * local_218 * top_blob->elemsize + (long)top_blob->data
                            );
          pvVar5 = (this->weight_data_tm).data;
          iVar29 = 0;
          do {
            if (-1 < iVar18) {
              uVar26 = 0;
              do {
                if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                  auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar66 = ZEXT3264(*(undefined1 (*) [32])
                                      ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                                      local_218 * 0x20));
                }
                auVar68 = auVar66._0_32_;
                if (0 < (int)uVar24) {
                  lVar37 = 0;
                  do {
                    auVar54 = vfmadd231ps_fma(auVar66._0_32_,
                                              *(undefined1 (*) [32])
                                               ((long)&((Allocator *)
                                                       ((long)local_1f8.data +
                                                       (long)*(int *)((long)(_func_int ***)
                                                                            local_1a8.data + lVar37)
                                                       * 4 * 8))->_vptr_Allocator +
                                               (long)((this->super_ConvolutionDepthWise).stride_w *
                                                      (int)uVar26 * 8) * 4 +
                                               (long)(this->super_ConvolutionDepthWise).stride_h *
                                               (long)iVar29 * (long)local_1f8.w * local_1f8.elemsize
                                               + local_1f8.cstep * local_218 * local_1f8.elemsize),
                                              *(undefined1 (*) [32])
                                               ((long)pvVar5 + lVar37 * 8 + (long)iVar21 * 4));
                    auVar66 = ZEXT1664(auVar54);
                    auVar68 = ZEXT1632(auVar54);
                    lVar37 = lVar37 + 4;
                  } while ((ulong)uVar24 << 2 != lVar37);
                }
                *(undefined1 (*) [32])((long)pvVar31 + uVar26 * 0x20) = auVar68;
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar32);
            }
            pvVar31 = (void *)((long)pvVar31 + (long)(int)(uVar32 * 8) * 4);
            bVar41 = iVar29 != iVar30;
            iVar29 = iVar29 + 1;
          } while (bVar41);
        }
        local_218 = local_218 + 1;
        iVar21 = iVar21 + uVar24 * 8;
      } while (local_218 != uVar22);
    }
    pLVar4 = this->activation;
    if (pLVar4 != (Layer *)0x0) {
      (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
    }
LAB_003ff52f:
    if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
      operator_delete(local_1a8.data,local_1a8.elemsize - (long)local_1a8.data);
    }
  }
  iVar19 = 0;
LAB_003fea86:
  piVar3 = (int *)CONCAT44(local_1f8.refcount._4_4_,(int)local_1f8.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1f8.data != (Allocator *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}